

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

void uWS::WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::consume
               (char *src,uint length,WebSocketState<true> *wState,void *user)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint local_2c;
  byte *local_28;
  
  bVar4 = *(byte *)&wState->state >> 1;
  uVar6 = bVar4 & 0xf;
  local_2c = length;
  local_28 = (byte *)src;
  if ((bVar4 & 0xf) != 0) {
    local_28 = (byte *)(src + -(ulong)uVar6);
    local_2c = uVar6 + length;
    memcpy(local_28,(wState->state).spill,(ulong)uVar6);
  }
  if (((undefined1  [16])((undefined1  [16])wState->state & (undefined1  [16])0x1) ==
       (undefined1  [16])0x0) &&
     (bVar2 = consumeContinuation((char **)&local_28,&local_2c,wState,user), !bVar2)) {
    return;
  }
  if (5 < local_2c) {
    do {
      if ((*local_28 & 0x40) != 0) {
        lVar3 = us_socket_ext(0,user);
        if (*(char *)(lVar3 + 0x5d) != '\x01') goto LAB_00142f29;
        *(undefined1 *)(lVar3 + 0x5d) = 2;
      }
      bVar4 = *local_28;
      if (((((bVar4 & 0x30) != 0) || (bVar5 = bVar4 & 0xf, 10 < bVar5)) || ((byte)(bVar5 - 3) < 5))
         || ((2 < bVar5 && ((-1 < (char)bVar4 || ((~local_28[1] & 0x7e) == 0)))))) {
LAB_00142f29:
        us_socket_close(0,user);
        return;
      }
      bVar4 = local_28[1] & 0x7f;
      if (bVar4 < 0x7e) {
        bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<6u,unsigned_char>(bVar4,(char **)&local_28,&local_2c,wState,user);
      }
      else if (bVar4 == 0x7e) {
        if (local_2c < 8) break;
        bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<8u,unsigned_short>
                          (*(ushort *)(local_28 + 2) << 8 | *(ushort *)(local_28 + 2) >> 8,
                           (char **)&local_28,&local_2c,wState,user);
      }
      else {
        if (local_2c < 0xe) break;
        uVar1 = *(ulong *)(local_28 + 2);
        bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<14u,unsigned_long>
                          (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                           (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                           (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38,(char **)&local_28,&local_2c,
                           wState,user);
      }
      if (bVar2 != false) {
        return;
      }
    } while (5 < local_2c);
  }
  uVar6 = local_2c;
  if ((ulong)local_2c != 0) {
    memcpy((wState->state).spill,local_28,(ulong)local_2c);
    *(byte *)&wState->state = *(byte *)&wState->state & 0xe1 | (char)uVar6 * '\x02' & 0x1eU;
  }
  return;
}

Assistant:

static inline void consume(char *src, unsigned int length, WebSocketState<isServer> *wState, void *user) {
        if (wState->state.spillLength) {
            src -= wState->state.spillLength;
            length += wState->state.spillLength;
            memcpy(src, wState->state.spill, wState->state.spillLength);
        }
        if (wState->state.wantsHead) {
            parseNext:
            while (length >= SHORT_MESSAGE_HEADER) {

                // invalid reserved bits / invalid opcodes / invalid control frames / set compressed frame
                if ((rsv1(src) && !Impl::setCompressed(wState, user)) || rsv23(src) || (getOpCode(src) > 2 && getOpCode(src) < 8) ||
                    getOpCode(src) > 10 || (getOpCode(src) > 2 && (!isFin(src) || payloadLength(src) > 125))) {
                    Impl::forceClose(wState, user);
                    return;
                }

                if (payloadLength(src) < 126) {
                    if (consumeMessage<SHORT_MESSAGE_HEADER, uint8_t>(payloadLength(src), src, length, wState, user)) {
                        return;
                    }
                } else if (payloadLength(src) == 126) {
                    if (length < MEDIUM_MESSAGE_HEADER) {
                        break;
                    } else if(consumeMessage<MEDIUM_MESSAGE_HEADER, uint16_t>(protocol::cond_byte_swap<uint16_t>(protocol::bit_cast<uint16_t>(src + 2)), src, length, wState, user)) {
                        return;
                    }
                } else if (length < LONG_MESSAGE_HEADER) {
                    break;
                } else if (consumeMessage<LONG_MESSAGE_HEADER, uint64_t>(protocol::cond_byte_swap<uint64_t>(protocol::bit_cast<uint64_t>(src + 2)), src, length, wState, user)) {
                    return;
                }
            }
            if (length) {
                memcpy(wState->state.spill, src, length);
                wState->state.spillLength = length & 0xf;
            }
        } else if (consumeContinuation(src, length, wState, user)) {
            goto parseNext;
        }
    }